

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void __thiscall
QVariantAnimationPrivate::setValueAt(QVariantAnimationPrivate *this,qreal step,QVariant *value)

{
  long lVar1;
  double dVar2;
  const_iterator pos;
  bool bVar3;
  undefined1 uVar4;
  iterator iVar5;
  pair<double,_QVariant> *ppVar6;
  QList<std::pair<double,_QVariant>_> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  iterator result;
  KeyValue pair;
  parameter_type in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  QVariant *in_stack_fffffffffffffeb8;
  pair<double,_QVariant> *in_stack_fffffffffffffec0;
  const_iterator in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffee0;
  iterator in_stack_fffffffffffffee8;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 force;
  iterator in_stack_ffffffffffffff38;
  const_iterator local_80;
  pair<double,_QVariant> *local_78;
  const_iterator local_70;
  iterator local_68;
  char local_60 [8];
  
  force = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dVar2 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if ((dVar2 < 0.0) || (1.0 < dVar2)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8);
    QMessageLogger::warning(in_XMM0_Da,local_60,"QVariantAnimation::setValueAt: invalid step = %f");
    goto LAB_0068ea16;
  }
  std::pair<double,_QVariant>::pair<double_&,_true>
            ((pair<double,_QVariant> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
             ,&in_stack_fffffffffffffea8->first,(QVariant *)0x68e796);
  local_68.i = (pair<double,_QVariant> *)&DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<double,_QVariant>_>::begin
            ((QList<std::pair<double,_QVariant>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  QList<std::pair<double,_QVariant>_>::end
            ((QList<std::pair<double,_QVariant>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  local_68 = std::
             lower_bound<QList<std::pair<double,QVariant>>::iterator,std::pair<double,QVariant>,bool(*)(std::pair<double,QVariant>const&,std::pair<double,QVariant>const&)>
                       (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffec0,
                        (_func_bool_pair<double,_QVariant>_ptr_pair<double,_QVariant>_ptr *)
                        in_stack_fffffffffffffeb8);
  iVar5 = QList<std::pair<double,_QVariant>_>::end
                    ((QList<std::pair<double,_QVariant>_> *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  bVar3 = QList<std::pair<double,_QVariant>_>::iterator::operator==(&local_68,iVar5);
  if (bVar3) {
LAB_0068e8a7:
    local_78 = local_68.i;
    QList<std::pair<double,_QVariant>_>::const_iterator::const_iterator(&local_70,local_68);
    in_stack_ffffffffffffff38 =
         QList<std::pair<double,_QVariant>_>::insert
                   ((QList<std::pair<double,_QVariant>_> *)
                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    in_stack_fffffffffffffec8,in_stack_fffffffffffffea8);
  }
  else {
    ppVar6 = QList<std::pair<double,_QVariant>_>::iterator::operator->(&local_68);
    if ((ppVar6->first != dVar2) || (NAN(ppVar6->first) || NAN(dVar2))) goto LAB_0068e8a7;
    uVar4 = ::QVariant::isValid((QVariant *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    if ((bool)uVar4) {
      QList<std::pair<double,_QVariant>_>::iterator::operator->(&local_68);
      ::QVariant::operator=((QVariant *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    else {
      this_00 = (QList<std::pair<double,_QVariant>_> *)(in_RDI + 0x140);
      QList<std::pair<double,_QVariant>_>::const_iterator::const_iterator(&local_80,local_68);
      pos.i._7_1_ = uVar4;
      pos.i._0_7_ = in_stack_fffffffffffffed8;
      iVar5 = QList<std::pair<double,_QVariant>_>::erase(this_00,pos);
      force = (undefined1)((ulong)iVar5.i >> 0x38);
    }
  }
  recalculateCurrentInterval((QVariantAnimationPrivate *)in_stack_ffffffffffffff38.i,(bool)force);
  std::pair<double,_QVariant>::~pair((pair<double,_QVariant> *)0x68ea16);
LAB_0068ea16:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariantAnimationPrivate::setValueAt(qreal step, const QVariant &value)
{
    if (step < qreal(0.0) || step > qreal(1.0)) {
        qWarning("QVariantAnimation::setValueAt: invalid step = %f", step);
        return;
    }

    QVariantAnimation::KeyValue pair(step, value);

    QVariantAnimation::KeyValues::iterator result = std::lower_bound(keyValues.begin(), keyValues.end(), pair, animationValueLessThan);
    if (result == keyValues.end() || result->first != step) {
        keyValues.insert(result, pair);
    } else {
        if (value.isValid())
            result->second = value; // replaces the previous value
        else
            keyValues.erase(result); // removes the previous value
    }

    recalculateCurrentInterval(/*force=*/true);
}